

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O3

void __thiscall CHud::RenderScoreHud(CHud *this)

{
  CTextCursor *this_00;
  CTextureHandle CVar1;
  uint uVar2;
  anon_union_4_2_94730227_for_vector4_base<float>_1 aVar3;
  int iVar4;
  anon_union_4_2_94730227_for_vector4_base<float>_1 *paVar5;
  CNetObj_GameDataFlag *pCVar6;
  IClient *pIVar7;
  IGraphics *pIVar8;
  long lVar9;
  CNetObj_GameDataRace *pCVar10;
  ITextRender *pIVar11;
  vec2 vVar12;
  vec2 CursorPosition;
  vec2 Pos;
  vec2 CursorPosition_00;
  vec2 Pos_00;
  int iVar13;
  undefined1 (*pauVar14) [16];
  CAnimState *pCVar15;
  CGameClient *pCVar16;
  ulong uVar17;
  long lVar18;
  char *pcVar19;
  CUIRect *pCVar20;
  CPlayerInfoItem *pCVar21;
  int iVar22;
  anon_union_4_2_94730227_for_vector4_base<float>_1 *paVar23;
  int64 StringVersion;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar24;
  ulong uVar25;
  int *piVar26;
  int iVar27;
  long in_FS_OFFSET;
  bool bVar28;
  bool bVar29;
  float extraout_XMM0_Da;
  float fVar30;
  float extraout_XMM0_Da_00;
  float fVar31;
  float fVar32;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar33;
  float fVar34;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  CUIRect Rect;
  char aBuf [32];
  char aBuf_1 [32];
  CPlayerInfoItem aPlayerInfo [2];
  char aName [64];
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_22c;
  float local_228;
  float local_218;
  float local_214;
  anon_union_4_2_94730227_for_vector4_base<float>_1 local_208 [2];
  float local_200;
  anon_union_4_2_94730227_for_vector4_base<float>_1 local_1fc;
  undefined1 local_1f8 [16];
  undefined8 local_1e8;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined1 local_1c8 [16];
  ulong local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  vec4 local_198;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_188;
  float fStack_184;
  float local_180;
  float local_17c;
  vec4 local_178 [2];
  CTeeRenderInfo local_158;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_b8;
  float fStack_b4;
  float afStack_b0 [2];
  CUIRect local_a8 [3];
  char local_78 [32];
  char local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar16 = (this->super_CComponent).m_pClient;
  if ((((pCVar16->m_Snap).m_pGameData)->m_GameStateFlags & 0xc) == 0) {
    uVar2 = (pCVar16->m_GameInfo).m_GameFlags;
    fVar31 = ((float)pCVar16->m_pGraphics->m_ScreenWidth /
             (float)pCVar16->m_pGraphics->m_ScreenHeight) * 300.0;
    local_1f8._0_4_ = uVar2;
    if ((((uVar2 & 1) == 0) || ((uVar2 & 8) != 0)) ||
       ((pCVar16->m_Snap).m_pGameDataTeam == (CNetObj_GameDataTeam *)0x0)) {
      local_208[0].x = 1.4013e-45;
      local_1fc.x = 2.8026e-45;
      local_a8[0] = (CUIRect)ZEXT416(0);
      _local_b8 = (CUIRect)ZEXT416(0);
      pCVar21 = (pCVar16->m_Snap).m_aInfoByScore;
      local_1d8.y = -NAN;
      aVar24.y = 0.0;
      uVar17 = 0;
      while (pCVar21->m_pPlayerInfo != (CNetObj_PlayerInfo *)0x0) {
        if (pCVar16->m_aClients[pCVar21->m_ClientID].m_Team != -1) {
          *(CPlayerInfoItem *)((undefined1 (*) [16])local_a8 + (long)(int)aVar24 + -1) = *pCVar21;
          if (*(int *)((long)((undefined1 (*) [16])local_a8)[(long)(int)aVar24 + -1] + 8) ==
              pCVar16->m_LocalClientID) {
            local_1d8 = aVar24;
          }
          aVar24.y = aVar24.y + 1;
        }
        uVar25 = uVar17 + 1;
        bVar28 = uVar17 < 0x3f;
        if ((1 < (int)aVar24) ||
           (pCVar21 = pCVar21 + 1, bVar29 = 0x3e < uVar17, uVar17 = uVar25, bVar29))
        goto LAB_001446c5;
      }
      bVar28 = true;
      uVar25 = uVar17 & 0xffffffff;
LAB_001446c5:
      if (local_1d8 == (anon_union_4_2_947302a4_for_vector2_base<float>_3)0xffffffff) {
        fVar32 = (float)pCVar16->m_LocalClientID;
        local_1d8.y = -NAN;
        if (((long)(int)fVar32 != -1) &&
           (!(bool)(bVar28 ^ 1) && pCVar16->m_aClients[(int)fVar32].m_Team != -1)) {
          uVar25 = uVar25 & 0xffffffff;
          pCVar20 = (CUIRect *)&(pCVar16->m_Snap).m_aInfoByScore[uVar25].m_pPlayerInfo;
          lVar18 = 0;
          if (uVar25 < 0x40) {
            lVar18 = 0x3f - uVar25;
          }
          lVar18 = lVar18 + 1;
          local_1fc.x = 2.8026e-45;
          do {
            if (*(CNetObj_PlayerInfo **)pCVar20 == (CNetObj_PlayerInfo *)0x0) break;
            local_1fc.x = local_1fc.x + (uint)(pCVar16->m_aClients[(int)pCVar20->w].m_Team != -1);
            if (pCVar20->w == fVar32) {
              local_a8[0] = *pCVar20;
              local_1d8.y = 1.4013e-45;
              goto LAB_001446cf;
            }
            pCVar20 = pCVar20 + 1;
            lVar18 = lVar18 + -1;
          } while (lVar18 != 0);
        }
      }
LAB_001446cf:
      if ((RenderScoreHud()::s_ScoreCursors == '\0') &&
         (iVar13 = __cxa_guard_acquire(&RenderScoreHud()::s_ScoreCursors), iVar13 != 0)) {
        CTextCursor::CTextCursor(RenderScoreHud::s_ScoreCursors);
        CTextCursor::CTextCursor(RenderScoreHud::s_ScoreCursors + 1);
        __cxa_atexit(__cxx_global_array_dtor_15,0,&__dso_handle);
        __cxa_guard_release(&RenderScoreHud()::s_ScoreCursors);
      }
      if ((RenderScoreHud()::s_PositionCursors == '\0') &&
         (iVar13 = __cxa_guard_acquire(&RenderScoreHud()::s_PositionCursors), iVar13 != 0)) {
        CTextCursor::CTextCursor(RenderScoreHud::s_PositionCursors);
        CTextCursor::CTextCursor(RenderScoreHud::s_PositionCursors + 1);
        __cxa_atexit(__cxx_global_array_dtor_16,0,&__dso_handle);
        __cxa_guard_release(&RenderScoreHud()::s_PositionCursors);
      }
      fVar32 = *(float *)(&DAT_001d9af4 + (ulong)((uVar2 & 8) == 0) * 4);
      paVar23 = local_208;
      pauVar14 = (undefined1 (*) [16])&local_b8;
      lVar18 = 0;
      bVar28 = true;
      do {
        bVar29 = bVar28;
        RenderScoreHud::s_ScoreCursors[lVar18].m_FontSize = fVar32;
        lVar9 = *(long *)*pauVar14;
        local_1e8 = paVar23;
        if (lVar9 == 0) {
          local_178[0]._0_8_ = local_178[0]._0_8_ & 0xffffffffffffff00;
          StringVersion = -1;
        }
        else {
          if ((local_1f8 & (undefined1  [16])0x8) == (undefined1  [16])0x0) {
            str_format((char *)local_178,0x20,"%d");
          }
          else {
            pCVar10 = (((this->super_CComponent).m_pClient)->m_Snap).m_pGameDataRace;
            if (pCVar10 == (CNetObj_GameDataRace *)0x0) {
              iVar13 = 3;
            }
            else {
              iVar13 = pCVar10->m_Precision;
            }
            FormatTime((char *)local_178,0x20,*(int *)(lVar9 + 4),iVar13);
          }
          StringVersion = (int64)*(int *)(lVar9 + 4);
        }
        CTextCursor::Reset(RenderScoreHud::s_ScoreCursors + lVar18,StringVersion);
        pIVar11 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar11->super_IInterface)._vptr_IInterface[7])
                  (pIVar11,RenderScoreHud::s_ScoreCursors + lVar18,local_178,0xffffffff);
        CTextCursor::Reset(RenderScoreHud::s_PositionCursors + lVar18,0);
        str_format((char *)local_178,0x20,"%d.",(ulong)(uint)*local_1e8);
        RenderScoreHud::s_PositionCursors[lVar18].m_FontSize = 10.0;
        pIVar11 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar11->super_IInterface)._vptr_IInterface[7])
                  (pIVar11,RenderScoreHud::s_PositionCursors + lVar18,local_178,0xffffffff);
        lVar18 = 1;
        pauVar14 = (undefined1 (*) [16])local_a8;
        paVar23 = &local_1fc;
        bVar28 = false;
      } while (bVar29);
      fVar32 = RenderScoreHud::s_ScoreCursors[0].m_Width;
      if (RenderScoreHud::s_ScoreCursors[0].m_Width <= RenderScoreHud::s_ScoreCursors[1].m_Width) {
        fVar32 = RenderScoreHud::s_ScoreCursors[1].m_Width;
      }
      pIVar11 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar11->super_IInterface)._vptr_IInterface[6])(pIVar11,"10",0xffffffff);
      aVar24 = local_1d8;
      if (fVar32 <= extraout_XMM0_Da) {
        fVar32 = extraout_XMM0_Da;
      }
      if ((local_1f8 & (undefined1  [16])0x4) == (undefined1  [16])0x0) {
        local_218 = (fVar31 - fVar32) + -16.0;
        local_22c.x = local_218 + -6.0;
      }
      else {
        if ((RenderScoreHud()::s_PlayerCountCursor == '\0') &&
           (iVar13 = __cxa_guard_acquire(&RenderScoreHud()::s_PlayerCountCursor), iVar13 != 0)) {
          CTextCursor::CTextCursor(&RenderScoreHud::s_PlayerCountCursor,8.0,0);
          __cxa_atexit(CTextCursor::~CTextCursor,&RenderScoreHud::s_PlayerCountCursor,&__dso_handle)
          ;
          __cxa_guard_release(&RenderScoreHud()::s_PlayerCountCursor);
          aVar24 = local_1d8;
        }
        pcVar19 = "%d players left";
        if ((((this->super_CComponent).m_pClient)->m_Snap).m_AliveCount[0] == 1) {
          pcVar19 = "%d player left";
        }
        pcVar19 = Localize(pcVar19,"");
        str_format((char *)&local_158,0x20,pcVar19,
                   (ulong)(uint)(((this->super_CComponent).m_pClient)->m_Snap).m_AliveCount[0]);
        CTextCursor::Reset(&RenderScoreHud::s_PlayerCountCursor,
                           (long)(g_Localization.m_CurrentVersion << 8 |
                                 (((this->super_CComponent).m_pClient)->m_Snap).m_AliveCount[0]));
        pIVar11 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar11->super_IInterface)._vptr_IInterface[7])
                  (pIVar11,&RenderScoreHud::s_PlayerCountCursor,&local_158,0xffffffff);
        RenderScoreHud::s_PlayerCountCursor.m_CursorPos.field_0.x =
             (fVar31 - RenderScoreHud::s_PlayerCountCursor.m_Width) + -1.0;
        local_218 = (fVar31 - fVar32) + -16.0;
        local_22c.x = local_218 + -6.0;
        if (local_22c.x <= RenderScoreHud::s_PlayerCountCursor.m_CursorPos.field_0.x) {
          RenderScoreHud::s_PlayerCountCursor.m_CursorPos.field_0.x = local_22c.x;
        }
        RenderScoreHud::s_PlayerCountCursor.m_CursorPos.field_1.y = 217.0;
        pIVar11 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar11->super_IInterface)._vptr_IInterface[0x10])
                  (pIVar11,&RenderScoreHud::s_PlayerCountCursor,0,0xffffffff);
      }
      local_214 = fVar31 - fVar32;
      local_1a8 = 0;
      if ((local_1f8 & (undefined1  [16])0x8) != (undefined1  [16])0x0) {
        local_1a8 = 0x40000000;
      }
      uStack_1a0 = 0;
      local_22c.x = local_22c.x + -16.0;
      local_200 = fVar32 + 16.0 + 6.0 + 16.0;
      local_1b0 = (ulong)(uint)aVar24;
      fVar34 = 229.0;
      uVar17 = 0;
      do {
        uVar38 = 0;
        uVar37 = 0;
        uVar36 = 0;
        fVar30 = (float)(int)uVar17;
        local_1e8 = (anon_union_4_2_94730227_for_vector4_base<float>_1 *)
                    CONCAT44(local_1e8._4_4_,fVar30);
        fStack_184 = fVar30 * 20.0 + fVar34;
        local_1f8 = ZEXT416((uint)fStack_184);
        local_188 = local_22c;
        local_180 = local_200;
        local_17c = 18.0;
        (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[8])
                  ();
        local_158.m_aTextures[1].m_Id = 0x3f800000;
        if (uVar17 != local_1b0) {
          local_158.m_aTextures[1].m_Id = 0;
        }
        local_158.m_aTextures[0].m_Id = local_158.m_aTextures[1].m_Id;
        local_158.m_aTextures[3].m_Id = 0x3e800000;
        local_158.m_aTextures[2].m_Id = local_158.m_aTextures[1].m_Id;
        CUIRect::Draw((CUIRect *)&local_188,(vec4 *)&local_158,5.0,5);
        vVar12.field_1.y = (float)local_1f8._0_4_ + (float)local_1a8;
        vVar12.field_0.x =
             (fVar32 - RenderScoreHud::s_ScoreCursors[uVar17].m_Width) * 0.5 + local_214 + -3.0;
        RenderScoreHud::s_ScoreCursors[uVar17].m_CursorPos = vVar12;
        pIVar11 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar11->super_IInterface)._vptr_IInterface[0x10])
                  (pIVar11,RenderScoreHud::s_ScoreCursors + uVar17,0,0xffffffff);
        if (*(long *)((undefined1 (*) [16])local_a8 + (uVar17 - 1)) != 0) {
          if ((RenderScoreHud()::s_NameCursor == '\0') &&
             (iVar13 = __cxa_guard_acquire(&RenderScoreHud()::s_NameCursor), iVar13 != 0)) {
            CTextCursor::CTextCursor(&RenderScoreHud::s_NameCursor,8.0,0);
            __cxa_atexit(CTextCursor::~CTextCursor,&RenderScoreHud::s_NameCursor,&__dso_handle);
            __cxa_guard_release(&RenderScoreHud()::s_NameCursor);
          }
          CTextCursor::Reset(&RenderScoreHud::s_NameCursor,-1);
          iVar13 = *(int *)((long)((undefined1 (*) [16])local_a8)[uVar17 - 1] + 8);
          pCVar16 = (this->super_CComponent).m_pClient;
          local_1f8._0_8_ = (long)iVar13 * 0x5b0;
          pcVar19 = pCVar16->m_aClients[iVar13].m_aName;
          if (pCVar16->m_pConfig->m_ClShowsocial == 0) {
            pcVar19 = "";
          }
          str_format(local_78,0x40,"%s",pcVar19);
          pIVar11 = ((this->super_CComponent).m_pClient)->m_pTextRender;
          (*(pIVar11->super_IInterface)._vptr_IInterface[7])
                    (pIVar11,&RenderScoreHud::s_NameCursor,local_78,0xffffffff);
          local_1d8.y = RenderScoreHud::s_NameCursor.m_Width;
          fVar30 = CUI::GetClientIDRectWidth(&((this->super_CComponent).m_pClient)->m_UI,8.0);
          aVar35.x = (fVar31 - (fVar30 + local_1d8.y)) + -1.0;
          if (local_22c.x <= aVar35.x) {
            aVar35.x = local_22c.x;
          }
          local_1c8 = ZEXT416((uint)aVar35);
          local_1d8.y = (float)((int)uVar17 + 1) * 20.0 + fVar34 + -3.0;
          local_158.m_aTextures[0].m_Id = 0x3f800000;
          local_158.m_aTextures[1].m_Id = 0x3f800000;
          local_158.m_aTextures[2].m_Id = 0x3f800000;
          local_158.m_aTextures[3].m_Id = 0x3f000000;
          local_198.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3dcccccd;
          local_198.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3dcccccd;
          local_198.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3dcccccd;
          local_198.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
          CursorPosition_00.field_1 = local_1d8;
          CursorPosition_00.field_0.x = aVar35.x;
          uStack_1d4 = uVar36;
          uStack_1d0 = uVar37;
          uStack_1cc = uVar38;
          fVar30 = CUI::DrawClientID(&((this->super_CComponent).m_pClient)->m_UI,
                                     RenderScoreHud::s_NameCursor.m_FontSize,CursorPosition_00,
                                     iVar13,(vec4 *)&local_158,&local_198);
          RenderScoreHud::s_NameCursor.m_CursorPos.field_0.x = fVar30 + (float)local_1c8._0_4_;
          RenderScoreHud::s_NameCursor.m_CursorPos.field_1.y = local_1d8.y;
          pIVar11 = ((this->super_CComponent).m_pClient)->m_pTextRender;
          (*(pIVar11->super_IInterface)._vptr_IInterface[0x10])
                    (pIVar11,&RenderScoreHud::s_NameCursor,0);
          pCVar16 = (this->super_CComponent).m_pClient;
          memcpy(&local_158,
                 (void *)((long)&pCVar16->m_aClients[0].m_RenderInfo.m_aTextures[0].m_Id +
                         local_1f8._0_8_),0x9c);
          local_158.m_Size = 18.0;
          pCVar15 = CAnimState::GetIdle();
          Pos_00.field_1.y = local_1e8._0_4_ * 20.0 + fVar34 + 1.0 + local_158.m_Size * 0.5;
          Pos_00.field_0.x = (local_214 - local_158.m_Size * 0.5) + -3.0;
          CRenderTools::RenderTee
                    (&pCVar16->m_RenderTools,pCVar15,&local_158,0,(vec2)0x3f800000,Pos_00);
        }
        RenderScoreHud::s_PositionCursors[uVar17].m_CursorPos.field_0.x = local_218 + -3.0 + -16.0;
        RenderScoreHud::s_PositionCursors[uVar17].m_CursorPos.field_1.y =
             local_1e8._0_4_ * 20.0 + fVar34 + 2.0;
        pIVar11 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar11->super_IInterface)._vptr_IInterface[0x10])
                  (pIVar11,RenderScoreHud::s_PositionCursors + uVar17,0,0xffffffff);
        fVar34 = fVar34 + 8.0;
        bVar28 = uVar17 == 0;
        uVar17 = uVar17 + 1;
      } while (bVar28);
    }
    else {
      if ((RenderScoreHud()::s_ExpectedScoreWidth == '\0') &&
         (iVar13 = __cxa_guard_acquire(&RenderScoreHud()::s_ExpectedScoreWidth), iVar13 != 0)) {
        pIVar11 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar11->super_IInterface)._vptr_IInterface[6])(pIVar11,"100",0xffffffff);
        RenderScoreHud::s_ExpectedScoreWidth = extraout_XMM0_Da_00;
        __cxa_guard_release(&RenderScoreHud()::s_ExpectedScoreWidth);
      }
      if ((RenderScoreHud()::s_TeamscoreCursors == '\0') &&
         (iVar13 = __cxa_guard_acquire(&RenderScoreHud()::s_TeamscoreCursors), iVar13 != 0)) {
        CTextCursor::CTextCursor(RenderScoreHud::s_TeamscoreCursors);
        CTextCursor::CTextCursor(RenderScoreHud::s_TeamscoreCursors + 1);
        __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
        __cxa_guard_release(&RenderScoreHud()::s_TeamscoreCursors);
      }
      if ((RenderScoreHud()::s_PlayerCountCursors == '\0') &&
         (iVar13 = __cxa_guard_acquire(&RenderScoreHud()::s_PlayerCountCursors), iVar13 != 0)) {
        CTextCursor::CTextCursor(RenderScoreHud::s_PlayerCountCursors);
        CTextCursor::CTextCursor(RenderScoreHud::s_PlayerCountCursors + 1);
        __cxa_atexit(__cxx_global_array_dtor_11,0,&__dso_handle);
        __cxa_guard_release(&RenderScoreHud()::s_PlayerCountCursors);
      }
      paVar5 = (anon_union_4_2_94730227_for_vector4_base<float>_1 *)
               (((this->super_CComponent).m_pClient)->m_Snap).m_pGameDataTeam;
      paVar23 = &local_198.field_0;
      local_198.field_0 = *paVar5;
      aVar3 = paVar5[1];
      lVar18 = 0;
      pcVar19 = local_78;
      local_208[0] = aVar3;
      str_format(pcVar19,0x20,"%d");
      str_format(local_58,0x20,"%d",(ulong)(uint)aVar3);
      bVar28 = true;
      do {
        bVar29 = bVar28;
        RenderScoreHud::s_TeamscoreCursors[lVar18].m_FontSize = 14.0;
        CTextCursor::Reset(RenderScoreHud::s_TeamscoreCursors + lVar18,(long)(int)*paVar23);
        pIVar11 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar11->super_IInterface)._vptr_IInterface[7])
                  (pIVar11,RenderScoreHud::s_TeamscoreCursors + lVar18,pcVar19,0xffffffff);
        lVar18 = 1;
        paVar23 = local_208;
        pcVar19 = local_58;
        bVar28 = false;
      } while (bVar29);
      local_1d8.y = RenderScoreHud::s_TeamscoreCursors[0].m_Width;
      if (RenderScoreHud::s_TeamscoreCursors[0].m_Width <=
          RenderScoreHud::s_TeamscoreCursors[1].m_Width) {
        local_1d8.y = RenderScoreHud::s_TeamscoreCursors[1].m_Width;
      }
      if (local_1d8.y <= RenderScoreHud::s_ExpectedScoreWidth) {
        local_1d8.y = RenderScoreHud::s_ExpectedScoreWidth;
      }
      CVar1.m_Id = *(int *)(&DAT_001d9aec +
                           (ulong)((local_1f8 & (undefined1  [16])0x2) == (undefined1  [16])0x0) * 4
                           );
      fVar32 = fVar31 - local_1d8.y;
      uVar36 = 0;
      uVar37 = 0;
      uVar38 = 0;
      aVar35.x = (fVar32 - (float)CVar1.m_Id) + -6.0;
      local_1c8._0_4_ = (float)CVar1.m_Id + local_1d8.y + 6.0;
      fVar34 = 229.0;
      lVar18 = 0;
      do {
        fStack_b4 = (float)(int)lVar18 * 20.0 + fVar34;
        local_1e8 = (anon_union_4_2_94730227_for_vector4_base<float>_1 *)
                    CONCAT44(local_1e8._4_4_,fStack_b4);
        local_b8 = aVar35;
        afStack_b0[0] = (float)local_1c8._0_4_;
        afStack_b0[1] = 18.0;
        (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[8])
                  ();
        local_158.m_aTextures[2].m_Id = 0;
        if (lVar18 == 0) {
          local_158.m_aTextures[0].m_Id = 0x3f800000;
        }
        else {
          local_158.m_aTextures[0].m_Id = 0;
          local_158.m_aTextures[2].m_Id = 0x3f800000;
        }
        local_158.m_aTextures[1].m_Id = 0;
        local_158.m_aTextures[3].m_Id = 0x3e800000;
        CUIRect::Draw((CUIRect *)&local_b8,(vec4 *)&local_158,5.0,5);
        RenderScoreHud::s_TeamscoreCursors[lVar18].m_CursorPos.field_0.x =
             (local_1d8.y - RenderScoreHud::s_TeamscoreCursors[lVar18].m_Width) * 0.5 + fVar32 +
             -3.0;
        RenderScoreHud::s_TeamscoreCursors[lVar18].m_CursorPos.field_1 = local_1e8._0_4_;
        pIVar11 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar11->super_IInterface)._vptr_IInterface[0x10])
                  (pIVar11,RenderScoreHud::s_TeamscoreCursors + lVar18,0,0xffffffff);
        if ((local_1f8 & (undefined1  [16])0x4) != (undefined1  [16])0x0) {
          RenderScoreHud::s_PlayerCountCursors[lVar18].m_FontSize = 8.0;
          pcVar19 = "%d player left";
          if ((((this->super_CComponent).m_pClient)->m_Snap).m_AliveCount[lVar18] != 1) {
            pcVar19 = "%d players left";
          }
          this_00 = RenderScoreHud::s_PlayerCountCursors + lVar18;
          pcVar19 = Localize(pcVar19,"");
          str_format((char *)&local_158,0x20,pcVar19,
                     (ulong)(uint)(((this->super_CComponent).m_pClient)->m_Snap).m_AliveCount
                                  [lVar18]);
          CTextCursor::Reset(this_00,(long)(g_Localization.m_CurrentVersion << 8 |
                                           (((this->super_CComponent).m_pClient)->m_Snap).
                                           m_AliveCount[lVar18]));
          pIVar11 = ((this->super_CComponent).m_pClient)->m_pTextRender;
          (*(pIVar11->super_IInterface)._vptr_IInterface[7])(pIVar11,this_00,&local_158,0xffffffff);
          aVar33.x = (fVar31 - RenderScoreHud::s_PlayerCountCursors[lVar18].m_Width) + -1.0;
          if (aVar35.x <= aVar33.x) {
            aVar33.x = aVar35.x;
          }
          RenderScoreHud::s_PlayerCountCursors[lVar18].m_CursorPos.field_0.x = (float)aVar33;
          RenderScoreHud::s_PlayerCountCursors[lVar18].m_CursorPos.field_1.y =
               (float)((int)lVar18 + 1) * 20.0 + fVar34 + -3.0;
          pIVar11 = ((this->super_CComponent).m_pClient)->m_pTextRender;
          (*(pIVar11->super_IInterface)._vptr_IInterface[0x10])(pIVar11,this_00,0,0xffffffff);
        }
        fVar34 = fVar34 + 8.0;
        bVar28 = lVar18 == 0;
        lVar18 = lVar18 + 1;
      } while (bVar28);
      if (((local_1f8 & (undefined1  [16])0x2) != (undefined1  [16])0x0) &&
         (pCVar6 = (((this->super_CComponent).m_pClient)->m_Snap).m_pGameDataFlag,
         pCVar6 != (CNetObj_GameDataFlag *)0x0)) {
        piVar26 = (int *)&local_188;
        local_188 = (anon_union_4_2_94730284_for_vector2_base<float>_1)pCVar6->m_FlagCarrierRed;
        fStack_184 = (float)pCVar6->m_FlagCarrierBlue;
        uVar17._0_4_ = pCVar6->m_FlagDropTickRed;
        uVar17._4_4_ = pCVar6->m_FlagDropTickBlue;
        local_228 = 229.0;
        iVar13 = 0x40;
        iVar27 = 0;
        local_1d8 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)uVar17._4_4_;
        aVar24 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)uVar17._4_4_;
        bVar28 = true;
        do {
          bVar29 = bVar28;
          iVar22 = 0x14;
          if (((int)uVar17 != 0) &&
             (pIVar7 = ((this->super_CComponent).m_pClient)->m_pClient, iVar22 = 0x14,
             0x18 < (pIVar7->m_CurGameTick - (int)uVar17) / pIVar7->m_GameTickSpeed)) {
            iVar22 = 10;
          }
          iVar4 = *piVar26;
          if (iVar4 == -1) {
            pCVar16 = (this->super_CComponent).m_pClient;
            if (((long)pCVar16->m_pClient->m_CurGameTick / (long)iVar22 & 1U) != 0)
            goto LAB_001442ee;
          }
          else if (iVar4 == -2) {
            pCVar16 = (this->super_CComponent).m_pClient;
LAB_001442ee:
            (*(pCVar16->m_pGraphics->super_IInterface)._vptr_IInterface[8])();
            pIVar8 = ((this->super_CComponent).m_pClient)->m_pGraphics;
            (*(pIVar8->super_IInterface)._vptr_IInterface[0x13])
                      (pIVar8,(ulong)(uint)g_pData->m_aImages[1].m_Id.m_Id);
            (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface
              [0x17])();
            CRenderTools::SelectSprite
                      (&((this->super_CComponent).m_pClient)->m_RenderTools,iVar13,0,0,0);
            local_158.m_aTextures[1].m_Id = (int)((float)iVar27 * 20.0 + local_228 + 1.0);
            local_158.m_aTextures[0].m_Id = (int)(fVar32 - (float)CVar1.m_Id);
            local_158.m_aTextures[3].m_Id = CVar1.m_Id;
            local_158.m_aTextures[2].m_Id = 0x41000000;
            pIVar8 = ((this->super_CComponent).m_pClient)->m_pGraphics;
            (*(pIVar8->super_IInterface)._vptr_IInterface[0x1d])(pIVar8,&local_158,1);
            (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface
              [0x18])();
          }
          else if (-1 < iVar4) {
            if ((RenderScoreHud()::s_CarrierCursor == '\0') &&
               (iVar13 = __cxa_guard_acquire(&RenderScoreHud()::s_CarrierCursor), iVar13 != 0)) {
              CTextCursor::CTextCursor(&RenderScoreHud::s_CarrierCursor,8.0,0);
              __cxa_atexit(CTextCursor::~CTextCursor,&RenderScoreHud::s_CarrierCursor,&__dso_handle)
              ;
              __cxa_guard_release(&RenderScoreHud()::s_CarrierCursor);
            }
            CTextCursor::Reset(&RenderScoreHud::s_CarrierCursor,-1);
            iVar13 = *piVar26 % 0x40;
            pCVar16 = (this->super_CComponent).m_pClient;
            pcVar19 = pCVar16->m_aClients[iVar13].m_aName;
            if (pCVar16->m_pConfig->m_ClShowsocial == 0) {
              pcVar19 = "";
            }
            str_format((char *)&local_b8,0x40,"%s",pcVar19);
            pIVar11 = ((this->super_CComponent).m_pClient)->m_pTextRender;
            (*(pIVar11->super_IInterface)._vptr_IInterface[7])
                      (pIVar11,&RenderScoreHud::s_CarrierCursor,&local_b8,0xffffffff);
            local_1e8 = (anon_union_4_2_94730227_for_vector4_base<float>_1 *)
                        CONCAT44(local_1e8._4_4_,RenderScoreHud::s_CarrierCursor.m_Width);
            fVar34 = CUI::GetClientIDRectWidth(&((this->super_CComponent).m_pClient)->m_UI,8.0);
            aVar33.x = (fVar31 - (fVar34 + local_1e8._0_4_)) + -1.0;
            if (aVar35.x <= aVar33.x) {
              aVar33.x = aVar35.x;
            }
            local_1f8 = ZEXT416((uint)aVar33);
            aVar24.y = (float)(iVar27 + 1) * 20.0 + local_228 + -3.0;
            local_1e8 = (anon_union_4_2_94730227_for_vector4_base<float>_1 *)CONCAT44(uVar36,aVar24)
            ;
            local_158.m_aTextures[0].m_Id = 0x3f800000;
            local_158.m_aTextures[1].m_Id = 0x3f800000;
            local_158.m_aTextures[2].m_Id = 0x3f800000;
            local_158.m_aTextures[3].m_Id = 0x3f000000;
            local_178[0].field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3dcccccd;
            local_178[0].field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3dcccccd;
            local_178[0].field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3dcccccd;
            local_178[0].field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
            CursorPosition.field_1.y = aVar24.y;
            CursorPosition.field_0.x = aVar33.x;
            uStack_1e0 = uVar37;
            uStack_1dc = uVar38;
            fVar34 = CUI::DrawClientID(&((this->super_CComponent).m_pClient)->m_UI,
                                       RenderScoreHud::s_CarrierCursor.m_FontSize,CursorPosition,
                                       iVar13,(vec4 *)&local_158,local_178);
            RenderScoreHud::s_CarrierCursor.m_CursorPos.field_0.x = fVar34 + (float)local_1f8._0_4_;
            RenderScoreHud::s_CarrierCursor.m_CursorPos.field_1 = local_1e8._0_4_;
            pIVar11 = ((this->super_CComponent).m_pClient)->m_pTextRender;
            (*(pIVar11->super_IInterface)._vptr_IInterface[0x10])
                      (pIVar11,&RenderScoreHud::s_CarrierCursor,0);
            pCVar16 = (this->super_CComponent).m_pClient;
            memcpy(&local_158,&pCVar16->m_aClients[iVar13].m_RenderInfo,0x9c);
            local_158.m_Size = 18.0;
            pCVar15 = CAnimState::GetIdle();
            uVar36 = 0;
            uVar37 = 0;
            uVar38 = 0;
            Pos.field_1.y = (float)iVar27 * 20.0 + local_228 + 1.0 + local_158.m_Size * 0.5;
            Pos.field_0.x = (fVar32 - local_158.m_Size * 0.5) + -3.0;
            CRenderTools::RenderTee
                      (&pCVar16->m_RenderTools,pCVar15,&local_158,0,(vec2)0x3f800000,Pos);
            aVar24 = local_1d8;
          }
          local_228 = local_228 + 8.0;
          iVar27 = 1;
          iVar13 = 0x3f;
          uVar17 = (ulong)(uint)aVar24;
          piVar26 = (int *)&fStack_184;
          bVar28 = false;
        } while (bVar29);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CHud::RenderScoreHud()
{
	// render small score hud
	if(!(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&(GAMESTATEFLAG_ROUNDOVER|GAMESTATEFLAG_GAMEOVER)))
	{
		int GameFlags = m_pClient->m_GameInfo.m_GameFlags;
		float Whole = 300*Graphics()->ScreenAspect();
		float StartY = 229.0f;
		const float TeamOffset = 20.0f;

		if(GameFlags&GAMEFLAG_TEAMS && m_pClient->m_Snap.m_pGameDataTeam && !(GameFlags&GAMEFLAG_RACE))
		{
			static float s_ExpectedScoreWidth = TextRender()->TextWidth(14.0f, "100", -1);
			static CTextCursor s_TeamscoreCursors[2];
			static CTextCursor s_PlayerCountCursors[2];
		
			char aScoreTeam[2][32];
			int Teamscores[2];
			Teamscores[0] = m_pClient->m_Snap.m_pGameDataTeam->m_TeamscoreRed;
			Teamscores[1] = m_pClient->m_Snap.m_pGameDataTeam->m_TeamscoreBlue;
			str_format(aScoreTeam[TEAM_RED], sizeof(aScoreTeam)/2, "%d", Teamscores[TEAM_RED]);
			str_format(aScoreTeam[TEAM_BLUE], sizeof(aScoreTeam)/2, "%d", Teamscores[TEAM_BLUE]);
			
			for(int t = 0; t < NUM_TEAMS; t++)
			{
				s_TeamscoreCursors[t].m_FontSize = 14.0f;
				s_TeamscoreCursors[t].Reset(Teamscores[t]);
				TextRender()->TextDeferred(&s_TeamscoreCursors[t], aScoreTeam[t], -1);
			}

			float ScoreWidthMax = maximum(maximum(s_TeamscoreCursors[0].Width(), s_TeamscoreCursors[1].Width()), s_ExpectedScoreWidth);
			float Split = 3.0f;
			float ImageSize = GameFlags&GAMEFLAG_FLAGS ? 16.0f : Split;

			for(int t = 0; t < NUM_TEAMS; t++)
			{
				// draw box
				CUIRect Rect = {Whole-ScoreWidthMax-ImageSize-2*Split, StartY+t*TeamOffset, ScoreWidthMax+ImageSize+2*Split, 18.0f};
				Graphics()->BlendNormal();
				Rect.Draw(t == 0 ? vec4(1.0f, 0.0f, 0.0f, 0.25f) : vec4(0.0f, 0.0f, 1.0f, 0.25f), 5.0f, CUIRect::CORNER_L);

				// draw score
				s_TeamscoreCursors[t].MoveTo(Whole-ScoreWidthMax+(ScoreWidthMax-s_TeamscoreCursors[t].Width())/2-Split, StartY+t*TeamOffset);
				TextRender()->DrawTextOutlined(&s_TeamscoreCursors[t]);

				if(GameFlags&GAMEFLAG_SURVIVAL)
				{
					s_PlayerCountCursors[t].m_FontSize = 8.0f;
					char aBuf[32];
					str_format(aBuf, sizeof(aBuf), m_pClient->m_Snap.m_AliveCount[t]==1 ? Localize("%d player left") : Localize("%d players left"),
								m_pClient->m_Snap.m_AliveCount[t]);

					s_PlayerCountCursors[t].Reset(g_Localization.Version() << 8 | m_pClient->m_Snap.m_AliveCount[t]);
					TextRender()->TextDeferred(&s_PlayerCountCursors[t], aBuf, -1);
					s_PlayerCountCursors[t].MoveTo(minimum(Whole-s_PlayerCountCursors[t].Width()-1.0f, Whole-ScoreWidthMax-ImageSize-2*Split), StartY+(t+1)*TeamOffset-3.0f);
					TextRender()->DrawTextOutlined(&s_PlayerCountCursors[t]);
				}
				StartY += 8.0f;
			}

			if(GameFlags&GAMEFLAG_FLAGS && m_pClient->m_Snap.m_pGameDataFlag)
			{
				int FlagCarrier[2] = { m_pClient->m_Snap.m_pGameDataFlag->m_FlagCarrierRed, m_pClient->m_Snap.m_pGameDataFlag->m_FlagCarrierBlue };
				int FlagDropTick[2] = { m_pClient->m_Snap.m_pGameDataFlag->m_FlagDropTickRed, m_pClient->m_Snap.m_pGameDataFlag->m_FlagDropTickBlue };
				StartY = 229.0f;

				for(int t = 0; t < 2; t++)
				{
					int BlinkTimer = (FlagDropTick[t] != 0 && (Client()->GameTick()-FlagDropTick[t])/Client()->GameTickSpeed() >= 25) ? 10 : 20;
					if(FlagCarrier[t] == FLAG_ATSTAND || (FlagCarrier[t] == FLAG_TAKEN && ((Client()->GameTick()/BlinkTimer)&1)))
					{
						// draw flag
						Graphics()->BlendNormal();
						Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
						Graphics()->QuadsBegin();
						RenderTools()->SelectSprite(t==0?SPRITE_FLAG_RED:SPRITE_FLAG_BLUE);
						IGraphics::CQuadItem QuadItem(Whole-ScoreWidthMax-ImageSize, StartY+1.0f+t*TeamOffset, ImageSize/2, ImageSize);
						Graphics()->QuadsDrawTL(&QuadItem, 1);
						Graphics()->QuadsEnd();
					}
					else if(FlagCarrier[t] >= 0)
					{
						// draw name
						static CTextCursor s_CarrierCursor(8.0f);
						s_CarrierCursor.Reset();

						int ID = FlagCarrier[t]%MAX_CLIENTS;
						char aName[64];
						str_format(aName, sizeof(aName), "%s", Config()->m_ClShowsocial ? m_pClient->m_aClients[ID].m_aName : "");

						TextRender()->TextDeferred(&s_CarrierCursor, aName, -1);

						float w = s_CarrierCursor.Width() + UI()->GetClientIDRectWidth(8.0f);
						float x = minimum(Whole-w-1.0f, Whole-ScoreWidthMax-ImageSize-2*Split);
						float y = StartY+(t+1)*TeamOffset-3.0f;
						
						float AdvanceID = UI()->DrawClientID(s_CarrierCursor.m_FontSize, vec2(x, y), ID);
						s_CarrierCursor.MoveTo(x + AdvanceID, y);
						TextRender()->DrawTextOutlined(&s_CarrierCursor);

						// draw tee of the flag holder
						CTeeRenderInfo Info = m_pClient->m_aClients[ID].m_RenderInfo;
						Info.m_Size = 18.0f;
						RenderTools()->RenderTee(CAnimState::GetIdle(), &Info, EMOTE_NORMAL, vec2(1,0),
							vec2(Whole-ScoreWidthMax-Info.m_Size/2-Split, StartY+1.0f+Info.m_Size/2+t*TeamOffset));
					}
					StartY += 8.0f;
				}
			}
		}
		else
		{
			int Local = -1;
			int aPos[2] = { 1, 2 };
			CGameClient::CPlayerInfoItem aPlayerInfo[2] = {{0}};
			int i = 0;
			for(int t = 0; t < 2 && i < MAX_CLIENTS && m_pClient->m_Snap.m_aInfoByScore[i].m_pPlayerInfo; ++i)
			{
				if(m_pClient->m_aClients[m_pClient->m_Snap.m_aInfoByScore[i].m_ClientID].m_Team != TEAM_SPECTATORS)
				{
					aPlayerInfo[t] = m_pClient->m_Snap.m_aInfoByScore[i];
					if(aPlayerInfo[t].m_ClientID == m_pClient->m_LocalClientID)
						Local = t;
					++t;
				}
			}
			// search local player info if not a spectator, nor within top2 scores
			if(Local == -1 && m_pClient->m_LocalClientID != -1 && m_pClient->m_aClients[m_pClient->m_LocalClientID].m_Team != TEAM_SPECTATORS)
			{
				for(; i < MAX_CLIENTS && m_pClient->m_Snap.m_aInfoByScore[i].m_pPlayerInfo; ++i)
				{
					if(m_pClient->m_aClients[m_pClient->m_Snap.m_aInfoByScore[i].m_ClientID].m_Team != TEAM_SPECTATORS)
						++aPos[1];
					if(m_pClient->m_Snap.m_aInfoByScore[i].m_ClientID == m_pClient->m_LocalClientID)
					{
						aPlayerInfo[1] = m_pClient->m_Snap.m_aInfoByScore[i];
						Local = 1;
						break;
					}
				}
			}

			float FontSize = (GameFlags&GAMEFLAG_RACE) ? 10.f : 14.f;
			static CTextCursor s_ScoreCursors[2];
			static CTextCursor s_PositionCursors[2];
			char aBuf[32];
			for(int t = 0; t < 2; ++t)
			{
				s_ScoreCursors[t].m_FontSize = FontSize;
				if(aPlayerInfo[t].m_pPlayerInfo)
				{
					if(GameFlags&GAMEFLAG_RACE)
						FormatTime(aBuf, sizeof(aBuf), aPlayerInfo[t].m_pPlayerInfo->m_Score, m_pClient->RacePrecision());
					else
						str_format(aBuf, sizeof(aBuf), "%d", aPlayerInfo[t].m_pPlayerInfo->m_Score);
					s_ScoreCursors[t].Reset(aPlayerInfo[t].m_pPlayerInfo->m_Score);
				}
				else
				{
					aBuf[0] = 0;
					s_ScoreCursors[t].Reset();
				}

				TextRender()->TextDeferred(&s_ScoreCursors[t], aBuf, -1);

				s_PositionCursors[t].Reset(0);
				str_format(aBuf, sizeof(aBuf), "%d.", aPos[t]);
				s_PositionCursors[t].m_FontSize = 10.0f;
				TextRender()->TextDeferred(&s_PositionCursors[t], aBuf, -1);
			}

			float ScoreWidthMax = maximum(maximum(s_ScoreCursors[0].Width(), s_ScoreCursors[1].Width()), TextRender()->TextWidth(FontSize, "10", -1));
			float Split = 3.0f, ImageSize = 16.0f, PosSize = 16.0f;

			if(GameFlags&GAMEFLAG_SURVIVAL)
			{
				// draw number of alive players
				static CTextCursor s_PlayerCountCursor(8.0f);
				char aBuf[32];
				str_format(aBuf, sizeof(aBuf), m_pClient->m_Snap.m_AliveCount[0] == 1 ? Localize("%d player left") : Localize("%d players left"),
					m_pClient->m_Snap.m_AliveCount[0]);
				s_PlayerCountCursor.Reset(g_Localization.Version() << 8 | m_pClient->m_Snap.m_AliveCount[0]);
				TextRender()->TextDeferred(&s_PlayerCountCursor, aBuf, -1);
				float w = s_PlayerCountCursor.Width();
				s_PlayerCountCursor.MoveTo(minimum(Whole - w - 1.0f, Whole - ScoreWidthMax - ImageSize - 2 * Split), StartY - 12.0f);
				TextRender()->DrawTextOutlined(&s_PlayerCountCursor);
			}

			for(int t = 0; t < 2; t++)
			{
				// draw box
				CUIRect Rect = {Whole-ScoreWidthMax-ImageSize-2*Split-PosSize, StartY+t*TeamOffset, ScoreWidthMax+ImageSize+2*Split+PosSize, 18.0f};
				Graphics()->BlendNormal();
				Rect.Draw(t == Local ? vec4(1.0f, 1.0f, 1.0f, 0.25f) : vec4(0.0f, 0.0f, 0.0f, 0.25f), 5.0f, CUIRect::CORNER_L);

				// draw score
				float Spacing = (GameFlags&GAMEFLAG_RACE) ? 2.f : 0.f;
				s_ScoreCursors[t].MoveTo(Whole-ScoreWidthMax+(ScoreWidthMax-s_ScoreCursors[t].Width())/2-Split, StartY+t*TeamOffset+Spacing);
				TextRender()->DrawTextOutlined(&s_ScoreCursors[t]);

				if(aPlayerInfo[t].m_pPlayerInfo)
				{
					// draw name
					static CTextCursor s_NameCursor(8.0f);
					s_NameCursor.Reset();

					int ID = aPlayerInfo[t].m_ClientID;
					char aName[64];
					str_format(aName, sizeof(aName), "%s", Config()->m_ClShowsocial ? m_pClient->m_aClients[ID].m_aName : "");

					TextRender()->TextDeferred(&s_NameCursor, aName, -1);

					float w = s_NameCursor.Width() + UI()->GetClientIDRectWidth(8.0f);
					float x = minimum(Whole-w-1.0f, Whole-ScoreWidthMax-ImageSize-2*Split-PosSize);
					float y = StartY+(t+1)*TeamOffset-3.0f;

					float AdvanceID = UI()->DrawClientID(s_NameCursor.m_FontSize, vec2(x, y), ID);
					s_NameCursor.MoveTo(x + AdvanceID, y);
					TextRender()->DrawTextOutlined(&s_NameCursor);

					// draw tee
					CTeeRenderInfo Info = m_pClient->m_aClients[ID].m_RenderInfo;
					Info.m_Size = 18.0f;
					RenderTools()->RenderTee(CAnimState::GetIdle(), &Info, EMOTE_NORMAL, vec2(1,0),
						vec2(Whole-ScoreWidthMax-Info.m_Size/2-Split, StartY+1.0f+Info.m_Size/2+t*TeamOffset));
				}

				// draw position
				s_PositionCursors[t].MoveTo(Whole-ScoreWidthMax-ImageSize-Split-PosSize, StartY+2.0f+t*TeamOffset);
				TextRender()->DrawTextOutlined(&s_PositionCursors[t]);

				StartY += 8.0f;
			}
		}
	}
}